

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunningSection::~RunningSection(RunningSection *this)

{
  deleteAll<std::vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>>>
            (&this->m_subSections);
  std::_Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::
  ~_Vector_base(&(this->m_subSections).
                 super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
               );
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

~RunningSection() {
            deleteAll( m_subSections );
        }